

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O3

void adjust_cost(AV1_COMP *cpi,MACROBLOCK *x,int64_t *rd_cost)

{
  int64_t *in_R8;
  int64_t rec_var;
  int64_t src_var;
  long local_28;
  long local_20;
  
  if ((((cpi->oxcf).algo_cfg.sharpness == 3) &&
      (((cpi->common).current_frame.frame_type & 0xfd) != 0)) &&
     (((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] & 0xfe) != 2)) {
    get_variance_stats(cpi,x,(int)&local_20,&local_28,in_R8);
    if (local_20 - local_28 != 0 && local_28 <= local_20) {
      *rd_cost = *rd_cost + (local_20 - local_28) * 0x80;
    }
  }
  return;
}

Assistant:

static void adjust_cost(const AV1_COMP *cpi, const MACROBLOCK *x,
                        int64_t *rd_cost) {
  if (cpi->oxcf.algo_cfg.sharpness != 3) return;

  if (frame_is_kf_gf_arf(cpi)) return;

  int64_t src_var, rec_var;
  get_variance_stats(cpi, x, 1, &src_var, &rec_var);

  if (src_var <= rec_var) return;

  int64_t var_offset = src_var - rec_var;

  *rd_cost += RDCOST(x->rdmult, 0, var_offset);
}